

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_inlinedHaarWavelets_precheck_boundaries
               (integral_image *iimage,interest_point *ipoint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int i;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int scale;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 in_register_00001404 [12];
  float local_dc;
  float local_d8;
  int local_d0;
  float ry;
  float rx;
  long local_c0;
  float local_b8;
  int local_b4;
  float local_b0;
  int local_ac;
  float local_a8;
  float local_a4;
  integral_image *local_a0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  interest_point *local_88;
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined1 auVar53 [64];
  
  auVar18._8_4_ = 0x3effffff;
  auVar18._0_8_ = 0x3effffff3effffff;
  auVar18._12_4_ = 0x3effffff;
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  fVar19 = ipoint->scale;
  auVar57 = ZEXT464((uint)fVar19);
  auVar39 = ZEXT816(0x3fe0000000000000);
  auVar56 = ZEXT1664(auVar39);
  local_78 = ZEXT416((uint)fVar19);
  auVar16 = vpternlogd_avx512vl(auVar18,local_78,auVar17,0xf8);
  auVar16 = ZEXT416((uint)(fVar19 + auVar16._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  scale = (int)auVar16._0_4_;
  local_a4 = -0.08 / (fVar19 * fVar19);
  fVar49 = ipoint->y;
  auVar54 = ZEXT464((uint)fVar49);
  auVar16 = vpternlogd_avx512vl(auVar18,ZEXT416((uint)ipoint->x),auVar17,0xf8);
  auVar55._0_8_ = (double)fVar19;
  auVar55._8_8_ = 0;
  auVar16 = ZEXT416((uint)(ipoint->x + auVar16._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  auVar50._0_8_ = (double)auVar16._0_4_;
  auVar50._8_8_ = auVar16._8_8_;
  auVar16 = vfmadd231sd_fma(auVar50,auVar55,auVar39);
  auVar58._0_4_ = (float)auVar16._0_8_;
  auVar58._4_12_ = auVar16._4_12_;
  auVar16 = vpternlogd_avx512vl(auVar18,ZEXT416((uint)fVar49),auVar17,0xf8);
  auVar16 = ZEXT416((uint)(fVar49 + auVar16._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  auVar51._0_8_ = (double)auVar16._0_4_;
  auVar51._8_8_ = auVar16._8_8_;
  auVar16 = vfmadd231sd_fma(auVar51,auVar55,auVar39);
  fVar49 = (float)auVar16._0_8_;
  auVar50 = ZEXT416((uint)fVar19);
  auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar50,auVar58);
  auVar17 = vpternlogd_avx512vl(auVar18,auVar16,auVar17,0xf8);
  auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  local_a0 = iimage;
  local_88 = ipoint;
  if (scale < (int)auVar16._0_4_) {
    auVar52._8_4_ = 0x3effffff;
    auVar52._0_8_ = 0x3effffff3effffff;
    auVar52._12_4_ = 0x3effffff;
    auVar53 = ZEXT1664(auVar52);
    auVar39._8_4_ = 0x80000000;
    auVar39._0_8_ = 0x8000000080000000;
    auVar39._12_4_ = 0x80000000;
    auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar50,ZEXT416((uint)fVar49));
    auVar17 = vpternlogd_avx512vl(auVar39,auVar16,auVar52,0xea);
    auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
    auVar16 = vroundss_avx(auVar16,auVar16,0xb);
    if (scale < (int)auVar16._0_4_) {
      auVar40._8_4_ = 0x80000000;
      auVar40._0_8_ = 0x8000000080000000;
      auVar40._12_4_ = 0x80000000;
      auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),auVar50,ZEXT416((uint)auVar58._0_4_))
      ;
      auVar17 = vpternlogd_avx512vl(auVar40,auVar16,auVar52,0xea);
      auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
      auVar16 = vroundss_avx(auVar16,auVar16,0xb);
      if ((int)auVar16._0_4_ + scale <= iimage->width) {
        auVar41._8_4_ = 0x80000000;
        auVar41._0_8_ = 0x8000000080000000;
        auVar41._12_4_ = 0x80000000;
        auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),auVar50,ZEXT416((uint)fVar49));
        auVar17 = vpternlogd_avx512vl(auVar41,auVar16,auVar52,0xea);
        auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
        auVar16 = vroundss_avx(auVar16,auVar16,0xb);
        if ((int)auVar16._0_4_ + scale <= iimage->height) {
          local_d8 = 0.0;
          iVar14 = 0;
          local_c0 = 0;
          iVar15 = -8;
          fVar19 = -2.5;
          while (iVar15 < 8) {
            local_b8 = fVar19 + 1.0;
            auVar16._0_4_ = (float)iVar15;
            auVar16._4_12_ = in_register_00001404;
            auVar16 = vfmadd213ss_fma(auVar16,auVar57._0_16_,ZEXT416((uint)auVar58._0_4_));
            local_c0 = (long)(int)local_c0;
            local_b0 = local_b8 * local_b8;
            auVar6._8_4_ = 0x80000000;
            auVar6._0_8_ = 0x8000000080000000;
            auVar6._12_4_ = 0x80000000;
            auVar17 = vpternlogd_avx512vl(auVar53._0_16_,auVar16,auVar6,0xf8);
            auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
            auVar16 = vroundss_avx(auVar16,auVar16,0xb);
            auVar30._0_4_ = (int)auVar16._0_4_;
            auVar30._4_4_ = (int)auVar16._4_4_;
            auVar30._8_4_ = (int)auVar16._8_4_;
            auVar30._12_4_ = (int)auVar16._12_4_;
            local_58 = vcvtdq2ps_avx(auVar30);
            local_d0 = -3;
            uVar13 = 0xfffffff8;
            local_dc = -2.5;
            local_b4 = iVar15;
            while (iVar15 = (int)uVar13, iVar15 < 8) {
              iVar11 = iVar15 + -4;
              local_dc = local_dc + 1.0;
              auVar31._0_4_ = (float)iVar15;
              auVar31._4_12_ = in_register_00001404;
              auVar16 = vfmadd213ss_fma(auVar31,auVar57._0_16_,ZEXT416((uint)fVar49));
              auVar7._8_4_ = 0x80000000;
              auVar7._0_8_ = 0x8000000080000000;
              auVar7._12_4_ = 0x80000000;
              auVar17 = vpternlogd_avx512vl(auVar53._0_16_,auVar16,auVar7,0xf8);
              auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
              auVar16 = vroundss_avx(auVar16,auVar16,0xb);
              auVar32._0_4_ = (int)auVar16._0_4_;
              auVar32._4_4_ = (int)auVar16._4_4_;
              auVar32._8_4_ = (int)auVar16._8_4_;
              auVar32._12_4_ = (int)auVar16._12_4_;
              local_68 = vcvtdq2ps_avx(auVar32);
              _local_98 = ZEXT816(0) << 0x20;
              local_80 = uVar13;
              while (iVar11 != local_d0) {
                auVar33._0_4_ = (float)iVar11;
                auVar33._4_12_ = auVar56._4_12_;
                auVar16 = vfmadd213ss_fma(auVar33,auVar57._0_16_,ZEXT416((uint)fVar49));
                auVar8._8_4_ = 0x80000000;
                auVar8._0_8_ = 0x8000000080000000;
                auVar8._12_4_ = 0x80000000;
                auVar17 = vpternlogd_avx512vl(auVar53._0_16_,auVar16,auVar8,0xf8);
                auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
                auVar17 = vroundss_avx(auVar16,auVar16,0xb);
                auVar34._0_4_ = (int)auVar17._0_4_;
                auVar34._4_4_ = (int)auVar17._4_4_;
                auVar34._8_4_ = (int)auVar17._8_4_;
                auVar34._12_4_ = (int)auVar17._12_4_;
                auVar16 = vcvtdq2ps_avx(auVar34);
                local_a8 = (float)local_68._0_4_ - auVar16._0_4_;
                local_a8 = local_a8 * local_a8;
                iVar15 = -0xc;
                local_ac = iVar11;
                while (iVar15 != -3) {
                  auVar35._0_4_ = (float)(iVar14 + iVar15);
                  auVar35._4_12_ = auVar54._4_12_;
                  auVar16 = vfmadd132ss_fma(auVar35,ZEXT416((uint)auVar58._0_4_),
                                            ZEXT416((uint)local_78._0_4_));
                  auVar47._8_4_ = 0x3effffff;
                  auVar47._0_8_ = 0x3effffff3effffff;
                  auVar47._12_4_ = 0x3effffff;
                  auVar9._8_4_ = 0x80000000;
                  auVar9._0_8_ = 0x8000000080000000;
                  auVar9._12_4_ = 0x80000000;
                  auVar18 = vpternlogd_avx512vl(auVar47,auVar16,auVar9,0xf8);
                  auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar18._0_4_));
                  auVar18 = vroundss_avx(auVar16,auVar16,0xb);
                  auVar36._0_4_ = (int)auVar18._0_4_;
                  auVar36._4_4_ = (int)auVar18._4_4_;
                  auVar36._8_4_ = (int)auVar18._8_4_;
                  auVar36._12_4_ = (int)auVar18._12_4_;
                  auVar16 = vcvtdq2ps_avx(auVar36);
                  fVar19 = (float)local_58._0_4_ - auVar16._0_4_;
                  local_48 = expf((fVar19 * fVar19 + local_a8) * local_a4);
                  rx = 0.0;
                  ry = 0.0;
                  haarXY_unconditional
                            (local_a0,(int)auVar17._0_4_ - scale,(int)auVar18._0_4_ - scale,scale,
                             &rx,&ry);
                  iVar15 = iVar15 + 1;
                  auVar16 = vinsertps_avx(ZEXT416((uint)ry),ZEXT416((uint)rx),0x10);
                  auVar37._0_4_ = local_48 * auVar16._0_4_;
                  auVar37._4_4_ = local_48 * auVar16._4_4_;
                  auVar37._8_4_ = local_48 * auVar16._8_4_;
                  auVar37._12_4_ = local_48 * auVar16._12_4_;
                  auVar10._8_4_ = 0x7fffffff;
                  auVar10._0_8_ = 0x7fffffff7fffffff;
                  auVar10._12_4_ = 0x7fffffff;
                  auVar16 = vandps_avx512vl(auVar37,auVar10);
                  auVar16 = vmovlhps_avx(auVar37,auVar16);
                  local_98._4_4_ = (float)local_98._4_4_ + auVar16._4_4_;
                  local_98._0_4_ = (float)local_98._0_4_ + auVar16._0_4_;
                  fStack_90 = fStack_90 + auVar16._8_4_;
                  fStack_8c = fStack_8c + auVar16._12_4_;
                }
                auVar57 = ZEXT1664(local_78);
                auVar53 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
                iVar11 = local_ac + 1;
              }
              uVar13 = (ulong)((int)local_80 + 5);
              fVar19 = expf((local_dc * local_dc + local_b0) * -0.22222222);
              auVar38._0_4_ = fVar19 * (float)local_98._0_4_;
              auVar38._4_4_ = fVar19 * (float)local_98._4_4_;
              auVar38._8_4_ = fVar19 * fStack_90;
              auVar38._12_4_ = fVar19 * fStack_8c;
              auVar57 = ZEXT1664(local_78);
              local_d0 = local_d0 + 5;
              auVar48._0_4_ = auVar38._0_4_ * auVar38._0_4_;
              auVar48._4_4_ = auVar38._4_4_ * auVar38._4_4_;
              auVar48._8_4_ = auVar38._8_4_ * auVar38._8_4_;
              auVar48._12_4_ = auVar38._12_4_ * auVar38._12_4_;
              auVar17 = vshufpd_avx(auVar38,auVar38,1);
              *(undefined1 (*) [16])(local_88->descriptor + local_c0) = auVar38;
              local_c0 = local_c0 + 4;
              auVar16 = vmovshdup_avx(auVar48);
              auVar18 = vfmadd231ss_fma(auVar16,auVar38,auVar38);
              auVar16 = vshufps_avx(auVar38,auVar38,0xff);
              auVar17 = vfmadd213ss_fma(auVar17,auVar17,auVar18);
              auVar16 = vfmadd213ss_fma(auVar16,auVar16,auVar17);
              auVar53 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
              local_d8 = local_d8 + auVar16._0_4_;
            }
            iVar14 = iVar14 + 5;
            fVar19 = local_b8;
            iVar15 = local_b4 + 5;
          }
          goto LAB_001497ae;
        }
      }
    }
  }
  local_d8 = 0.0;
  iVar14 = 0;
  local_c0 = 0;
  iVar15 = -8;
  fVar19 = -2.5;
  while (iVar15 < 8) {
    local_b8 = fVar19 + 1.0;
    auVar20._0_4_ = (float)iVar15;
    auVar20._4_12_ = in_register_00001404;
    auVar16 = vfmadd213ss_fma(auVar20,auVar57._0_16_,ZEXT416((uint)auVar58._0_4_));
    local_c0 = (long)(int)local_c0;
    local_b0 = local_b8 * local_b8;
    auVar42._8_4_ = 0x3effffff;
    auVar42._0_8_ = 0x3effffff3effffff;
    auVar42._12_4_ = 0x3effffff;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar17 = vpternlogd_avx512vl(auVar42,auVar16,auVar1,0xf8);
    auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
    auVar16 = vroundss_avx(auVar16,auVar16,0xb);
    auVar21._0_4_ = (int)auVar16._0_4_;
    auVar21._4_4_ = (int)auVar16._4_4_;
    auVar21._8_4_ = (int)auVar16._8_4_;
    auVar21._12_4_ = (int)auVar16._12_4_;
    local_58 = vcvtdq2ps_avx(auVar21);
    local_d0 = -3;
    uVar13 = 0xfffffff8;
    local_dc = -2.5;
    local_b4 = iVar15;
    while (iVar15 = (int)uVar13, iVar15 < 8) {
      auVar43._8_4_ = 0x3effffff;
      auVar43._0_8_ = 0x3effffff3effffff;
      auVar43._12_4_ = 0x3effffff;
      iVar11 = iVar15 + -4;
      local_dc = local_dc + 1.0;
      auVar22._0_4_ = (float)iVar15;
      auVar22._4_12_ = in_register_00001404;
      auVar16 = vfmadd213ss_fma(auVar22,auVar57._0_16_,ZEXT416((uint)fVar49));
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar17 = vpternlogd_avx512vl(auVar43,auVar16,auVar2,0xf8);
      auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
      auVar16 = vroundss_avx(auVar16,auVar16,0xb);
      auVar23._0_4_ = (int)auVar16._0_4_;
      auVar23._4_4_ = (int)auVar16._4_4_;
      auVar23._8_4_ = (int)auVar16._8_4_;
      auVar23._12_4_ = (int)auVar16._12_4_;
      local_68 = vcvtdq2ps_avx(auVar23);
      _local_98 = ZEXT816(0) << 0x20;
      local_80 = uVar13;
      while (iVar11 != local_d0) {
        auVar24._0_4_ = (float)iVar11;
        auVar24._4_12_ = in_register_00001404;
        auVar16 = vfmadd213ss_fma(auVar24,auVar57._0_16_,ZEXT416((uint)fVar49));
        auVar44._8_4_ = 0x3effffff;
        auVar44._0_8_ = 0x3effffff3effffff;
        auVar44._12_4_ = 0x3effffff;
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar17 = vpternlogd_avx512vl(auVar44,auVar16,auVar3,0xf8);
        auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
        auVar17 = vroundss_avx(auVar16,auVar16,0xb);
        auVar25._0_4_ = (int)auVar17._0_4_;
        auVar25._4_4_ = (int)auVar17._4_4_;
        auVar25._8_4_ = (int)auVar17._8_4_;
        auVar25._12_4_ = (int)auVar17._12_4_;
        auVar16 = vcvtdq2ps_avx(auVar25);
        local_a8 = (float)local_68._0_4_ - auVar16._0_4_;
        local_a8 = local_a8 * local_a8;
        iVar15 = -0xc;
        local_ac = iVar11;
        while (iVar15 != -3) {
          auVar26._0_4_ = (float)(iVar14 + iVar15);
          auVar26._4_12_ = in_register_00001404;
          auVar16 = vfmadd132ss_fma(auVar26,ZEXT416((uint)auVar58._0_4_),
                                    ZEXT416((uint)local_78._0_4_));
          auVar45._8_4_ = 0x3effffff;
          auVar45._0_8_ = 0x3effffff3effffff;
          auVar45._12_4_ = 0x3effffff;
          auVar4._8_4_ = 0x80000000;
          auVar4._0_8_ = 0x8000000080000000;
          auVar4._12_4_ = 0x80000000;
          auVar18 = vpternlogd_avx512vl(auVar45,auVar16,auVar4,0xf8);
          auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar18._0_4_));
          auVar18 = vroundss_avx(auVar16,auVar16,0xb);
          auVar27._0_4_ = (int)auVar18._0_4_;
          auVar27._4_4_ = (int)auVar18._4_4_;
          auVar27._8_4_ = (int)auVar18._8_4_;
          auVar27._12_4_ = (int)auVar18._12_4_;
          auVar16 = vcvtdq2ps_avx(auVar27);
          fVar19 = (float)local_58._0_4_ - auVar16._0_4_;
          local_48 = expf((fVar19 * fVar19 + local_a8) * local_a4);
          rx = 0.0;
          ry = 0.0;
          haarXY_precheck_boundaries
                    (local_a0,(int)auVar17._0_4_ - scale,(int)auVar18._0_4_ - scale,scale,&rx,&ry);
          iVar15 = iVar15 + 1;
          auVar16 = vinsertps_avx(ZEXT416((uint)ry),ZEXT416((uint)rx),0x10);
          auVar28._0_4_ = local_48 * auVar16._0_4_;
          auVar28._4_4_ = local_48 * auVar16._4_4_;
          auVar28._8_4_ = local_48 * auVar16._8_4_;
          auVar28._12_4_ = local_48 * auVar16._12_4_;
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar16 = vandps_avx512vl(auVar28,auVar5);
          auVar16 = vmovlhps_avx(auVar28,auVar16);
          local_98._4_4_ = (float)local_98._4_4_ + auVar16._4_4_;
          local_98._0_4_ = (float)local_98._0_4_ + auVar16._0_4_;
          fStack_90 = fStack_90 + auVar16._8_4_;
          fStack_8c = fStack_8c + auVar16._12_4_;
        }
        auVar57 = ZEXT1664(local_78);
        iVar11 = local_ac + 1;
      }
      uVar13 = (ulong)((int)local_80 + 5);
      fVar19 = expf((local_dc * local_dc + local_b0) * -0.22222222);
      auVar29._0_4_ = fVar19 * (float)local_98._0_4_;
      auVar29._4_4_ = fVar19 * (float)local_98._4_4_;
      auVar29._8_4_ = fVar19 * fStack_90;
      auVar29._12_4_ = fVar19 * fStack_8c;
      auVar57 = ZEXT1664(local_78);
      local_d0 = local_d0 + 5;
      auVar46._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar46._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar46._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar46._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar17 = vshufpd_avx(auVar29,auVar29,1);
      *(undefined1 (*) [16])(local_88->descriptor + local_c0) = auVar29;
      local_c0 = local_c0 + 4;
      auVar16 = vmovshdup_avx(auVar46);
      auVar18 = vfmadd231ss_fma(auVar16,auVar29,auVar29);
      auVar16 = vshufps_avx(auVar29,auVar29,0xff);
      auVar17 = vfmadd213ss_fma(auVar17,auVar17,auVar18);
      auVar16 = vfmadd213ss_fma(auVar16,auVar16,auVar17);
      local_d8 = local_d8 + auVar16._0_4_;
    }
    iVar14 = iVar14 + 5;
    fVar19 = local_b8;
    iVar15 = local_b4 + 5;
  }
LAB_001497ae:
  if (local_d8 < 0.0) {
    fVar19 = sqrtf(local_d8);
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)local_d8),ZEXT416((uint)local_d8));
    fVar19 = auVar16._0_4_;
  }
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 1) {
    local_88->descriptor[lVar12] = (1.0 / fVar19) * local_88->descriptor[lVar12];
  }
  return;
}

Assistant:

void get_msurf_descriptor_inlinedHaarWavelets_precheck_boundaries(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - using haarXY_precheck_boundaries function to compute Haar Wavelet responses at once with very naive reduction of if/MIN usage

    ideas:
        - more sophisticated boundary checking (before the haarXY_precheck_boundaries function call)
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;


    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    

    } else { // everything in borders
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    }
    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}